

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O2

DynamicRectMatrix<double> __thiscall
OpenMD::DynamicRectMatrix<double>::operator=
          (DynamicRectMatrix<double> *this,DynamicRectMatrix<double> *m)

{
  double **ppdVar1;
  double **ppdVar2;
  uint uVar3;
  uint uVar4;
  DynamicRectMatrix<double> *in_RDX;
  ulong uVar5;
  undefined8 extraout_RDX;
  uint j;
  ulong uVar6;
  DynamicRectMatrix<double> DVar7;
  
  if (m != in_RDX) {
    uVar3 = m->nrow_;
    if ((uVar3 != in_RDX->nrow_) || (uVar4 = m->ncol_, uVar4 != in_RDX->ncol_)) {
      deallocate(m);
      allocate(m,in_RDX->nrow_,in_RDX->ncol_);
      uVar3 = m->nrow_;
      uVar4 = m->ncol_;
    }
    for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
      ppdVar1 = in_RDX->data_;
      ppdVar2 = m->data_;
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        ppdVar2[uVar5][uVar6] = ppdVar1[uVar5][uVar6];
      }
    }
  }
  DynamicRectMatrix(this,m);
  DVar7.nrow_ = (int)extraout_RDX;
  DVar7.ncol_ = (int)((ulong)extraout_RDX >> 0x20);
  DVar7.data_ = (double **)this;
  return DVar7;
}

Assistant:

DynamicRectMatrix<Real> operator=(const DynamicRectMatrix<Real>& m) {
      if (this == &m) return *this;
      if (nrow_ != m.getNRow() || ncol_ != m.getNCol()) {
        deallocate();
        allocate(m.getNRow(), m.getNCol());
      }

      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = m.data_[i][j];
      return *this;
    }